

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzer.cpp
# Opt level: O0

bool __thiscall
HdmiCecAnalyzer::ReadBlockByte(HdmiCecAnalyzer *this,int blockIndex,Frame *byteFrame)

{
  bool bVar1;
  int iVar2;
  Frame *local_58;
  Frame *local_50;
  S64 *lastSample;
  S64 *firstSample;
  int bit;
  U8 byte;
  bool value;
  Frame *byteFrame_local;
  HdmiCecAnalyzer *pHStack_18;
  int blockIndex_local;
  HdmiCecAnalyzer *this_local;
  
  _bit = byteFrame;
  byteFrame_local._4_4_ = blockIndex;
  pHStack_18 = this;
  iVar2 = AnalyzerChannelData::GetBitState();
  if (iVar2 == 1) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  firstSample._6_1_ = 0;
  firstSample._0_4_ = 7;
  while( true ) {
    if ((int)firstSample < 0) {
      *(ulong *)(_bit + 0x10) = (ulong)firstSample._6_1_;
      if (byteFrame_local._4_4_ == 0) {
        _bit[0x20] = (Frame)0x1;
      }
      else if (byteFrame_local._4_4_ == 1) {
        _bit[0x20] = (Frame)0x2;
      }
      else {
        if (0xf < byteFrame_local._4_4_) {
          return false;
        }
        _bit[0x20] = (Frame)0x3;
      }
      return true;
    }
    if ((int)firstSample == 7) {
      local_50 = _bit;
    }
    else {
      local_50 = (Frame *)0x0;
    }
    if ((int)firstSample == 0) {
      local_58 = _bit + 8;
    }
    else {
      local_58 = (Frame *)0x0;
    }
    bVar1 = ReadBit(this,(bool *)((long)&firstSample + 7),(S64 *)local_50,(S64 *)local_58);
    if (!bVar1) break;
    firstSample._6_1_ =
         firstSample._6_1_ | (firstSample._7_1_ & 1) << ((byte)(int)firstSample & 0x1f);
    firstSample._0_4_ = (int)firstSample + -1;
  }
  return false;
}

Assistant:

bool HdmiCecAnalyzer::ReadBlockByte( int blockIndex, Frame& byteFrame )
{
    // The bus should be in LOW
    if( mCec->GetBitState() == BIT_HIGH )
        mCec->AdvanceToNextEdge();

    // Read block byte
    bool value;
    U8 byte = 0;

    for( int bit = 7; bit >= 0; bit-- )
    {
        S64* firstSample = ( bit == 7 ) ? &byteFrame.mStartingSampleInclusive : 0;
        S64* lastSample = ( bit == 0 ) ? &byteFrame.mEndingSampleInclusive : 0;
        if( !ReadBit( value, firstSample, lastSample ) )
            return false;
        byte |= value << bit;
    }
    byteFrame.mData1 = byte;

    // Depending on the position on the message set blockByte type
    if( !blockIndex )
        byteFrame.mType = HdmiCec::FrameType_Header;
    else if( blockIndex == 1 )
        byteFrame.mType = HdmiCec::FrameType_OpCode;
    else if( blockIndex < HdmiCec::MaxMessageBlocks )
        byteFrame.mType = HdmiCec::FrameType_Operand;
    else
        return false;

    return true;
}